

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,undefined8 x,long param_3)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,5);
  if (sVar1 != 0) {
    uVar4 = 0;
    do {
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,4);
      if (sVar1 != 0) {
        uVar2 = 0;
        lVar3 = param_3;
        do {
          OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
          ::operate(v,x,lVar3);
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,4);
          lVar3 = lVar3 + sVar1 * 4;
          uVar2 = uVar2 + 1;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,4);
        } while (uVar2 < sVar1);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,4);
      View<int,_false,_std::allocator<unsigned_long>_>::strides(v,4);
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,5);
      param_3 = param_3 + sVar1 * 4;
      uVar4 = uVar4 + 1;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,5);
    } while (uVar4 < sVar1);
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,5);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,5);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A>& v, 
        const T2& x, 
        Functor f, 
        T1* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinaryScalar<N-1, Functor, T1, T2, A>::operate(
                v, x, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }